

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues(BeliefSet *Beliefs,QFunctionsDiscrete *Q)

{
  bool bVar1;
  size_type __n;
  allocator_type *paVar2;
  reference pvVar3;
  allocator_type *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  uint j;
  QFDcit i;
  vector<double,_std::allocator<double>_> values;
  vector<double,_std::allocator<double>_> *maxValues;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_stack_ffffffffffffff28;
  __normal_iterator<const_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
  *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff38;
  allocator_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  vector<double,_std::allocator<double>_> *this;
  uint local_84;
  __normal_iterator<const_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
  local_60 [2];
  ValueFunctionPOMDPDiscrete *V;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vector<double,_std::allocator<double>_> local_30;
  allocator_type *local_10;
  
  local_10 = in_RSI;
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::size
            ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)in_RSI);
  std::allocator<double>::allocator((allocator<double> *)0x8fea30);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<double>::~allocator((allocator<double> *)0x8fea56);
  in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 & 0xffffff;
  __n = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::size
                  ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                   local_10);
  V = (ValueFunctionPOMDPDiscrete *)0xffefffffffffffff;
  this = (vector<double,_std::allocator<double>_> *)((long)&local_60[1]._M_current + 7);
  std::allocator<double>::allocator((allocator<double> *)0x8fea94);
  std::vector<double,_std::allocator<double>_>::vector
            (this,__n,(value_type_conflict3 *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::allocator<double>::~allocator((allocator<double> *)0x8feabf);
  local_60[0]._M_current =
       (vector<AlphaVector,_std::allocator<AlphaVector>_> *)
       std::
       vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
       ::begin(in_stack_ffffffffffffff28);
  while( true ) {
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::end(in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff30,
                       (__normal_iterator<const_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    in_stack_ffffffffffffff40 = local_10;
    __gnu_cxx::
    __normal_iterator<const_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
    ::operator*(local_60);
    GetValues((BeliefSet *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),V);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff38);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40);
    local_84 = 0;
    while( true ) {
      in_stack_ffffffffffffff38 = (allocator_type *)(ulong)local_84;
      paVar2 = (allocator_type *)std::vector<double,_std::allocator<double>_>::size(&local_30);
      if (in_stack_ffffffffffffff38 == paVar2) break;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(ulong)local_84);
      in_stack_ffffffffffffff30 =
           (__normal_iterator<const_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
            *)*pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)local_84);
      if (*pvVar3 < (double)in_stack_ffffffffffffff30) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(ulong)local_84)
        ;
        in_stack_ffffffffffffff28 =
             (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
              *)*pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)local_84);
        *pvVar3 = (value_type)in_stack_ffffffffffffff28;
      }
      local_84 = local_84 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
    ::operator++(local_60);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40);
  return in_RDI;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSet &Beliefs,
                                      const QFunctionsDiscrete &Q)
{
    vector<double> values(Beliefs.size()),
        maxValues(Beliefs.size(),-DBL_MAX);
    for(QFDcit i=Q.begin();i!=Q.end();++i)
    {
        values=GetValues(Beliefs,*i);
        for(unsigned int j=0;j!=values.size();++j)
            if(values[j]>maxValues[j])
                maxValues[j]=values[j];
    }

    return(maxValues);
}